

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

int Fraig_GetMaxLevel(Fraig_Man_t *pMan)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = pMan->vOutputs->nSize;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  iVar3 = 0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = *(int *)(((ulong)pMan->vOutputs->pArray[uVar5] & 0xfffffffffffffffe) + 8);
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
  }
  return iVar3;
}

Assistant:

int Fraig_GetMaxLevel( Fraig_Man_t * pMan )
{
    int nLevelMax, i;
    nLevelMax = 0;
    for ( i = 0; i < pMan->vOutputs->nSize; i++ )
        nLevelMax = nLevelMax > Fraig_Regular(pMan->vOutputs->pArray[i])->Level? 
                nLevelMax : Fraig_Regular(pMan->vOutputs->pArray[i])->Level;
    return nLevelMax;
}